

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *pUVar2;
  TestEventListeners *this;
  TestEventListener *listener;
  bool bVar3;
  long lVar4;
  int local_2c;
  
  local_2c = argc;
  testing::InitGoogleMock(&local_2c,argv);
  lVar4 = 1;
  signal(0xd,(__sighandler_t)0x1);
  pUVar2 = testing::UnitTest::GetInstance();
  this = testing::UnitTest::listeners(pUVar2);
  listener = (TestEventListener *)operator_new(8);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_00263510;
  testing::TestEventListeners::Append(this,listener);
  if (1 < local_2c) {
    bVar3 = true;
    do {
      iVar1 = strcmp(argv[lVar4],"--fork_unsafe_buffering");
      if (iVar1 == 0) {
        RAND_enable_fork_unsafe_buffering(-1);
      }
      iVar1 = strcmp(argv[lVar4],"--no_unwind_tests");
      if (iVar1 == 0) {
        bVar3 = false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_2c);
    if (!bVar3) goto LAB_0011fead;
  }
  abi_test::EnableUnwindTests();
LAB_0011fead:
  pUVar2 = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(pUVar2);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  testing::InitGoogleMock(&argc, argv);
  bssl::SetupGoogleTest();

  bool unwind_tests = true;
  for (int i = 1; i < argc; i++) {
#if !defined(OPENSSL_WINDOWS)
    if (strcmp(argv[i], "--fork_unsafe_buffering") == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
    }
#endif

#if (defined(OPENSSL_ARM) || defined(OPENSSL_AARCH64)) && \
    !defined(OPENSSL_STATIC_ARMCAP)
    if (strncmp(argv[i], "--cpu=", 6) == 0) {
      const char *cpu = argv[i] + 6;
      uint32_t armcap;
      if (strcmp(cpu, "none") == 0) {
        armcap = 0;
      } else if (strcmp(cpu, "neon") == 0) {
        armcap = ARMV7_NEON;
      } else if (strcmp(cpu, "crypto") == 0) {
        armcap = ARMV7_NEON | ARMV8_AES | ARMV8_SHA1 | ARMV8_SHA256 | ARMV8_PMULL;
      } else {
        fprintf(stderr, "Unknown CPU: %s\n", cpu);
        exit(1);
      }

      uint32_t *armcap_ptr = OPENSSL_get_armcap_pointer_for_test();
      if ((armcap & *armcap_ptr) != armcap) {
        fprintf(stderr,
                "Host CPU does not support features for testing CPU '%s'.\n",
                cpu);
        exit(89);
      }
      printf("Simulating CPU '%s'\n", cpu);
      *armcap_ptr = armcap;
    }
#endif  // (ARM || AARCH64) && !STATIC_ARMCAP

    if (strcmp(argv[i], "--no_unwind_tests") == 0) {
      unwind_tests = false;
    }
  }

  if (unwind_tests) {
    abi_test::EnableUnwindTests();
  }

  return RUN_ALL_TESTS();
}